

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary-writer.cc
# Opt level: O3

void __thiscall wabt::anon_unknown_1::BinaryWriter::BeginSubsection(BinaryWriter *this,char *name)

{
  size_t sVar1;
  ulong in_RAX;
  uint8_t data [5];
  ulong local_18;
  
  if (this->last_subsection_leb_size_guess_ == 0) {
    this->last_subsection_leb_size_guess_ = 1;
    local_18 = in_RAX & 0xffffff0000000000;
    sVar1 = this->stream_->offset_;
    Stream::WriteData(this->stream_,&local_18,(ulong)(this->options_->canonicalize_lebs ^ 1) * 4 + 1
                      ,"subsection size (guess)",No);
    this->last_subsection_offset_ = sVar1;
    this->last_subsection_payload_offset_ = this->stream_->offset_;
    return;
  }
  __assert_fail("last_subsection_leb_size_guess_ == 0",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/wapm-packages[P]wabt/src/binary-writer.cc"
                ,0x23d,
                "void wabt::(anonymous namespace)::BinaryWriter::BeginSubsection(const char *)");
}

Assistant:

void BinaryWriter::BeginSubsection(const char* name) {
  assert(last_subsection_leb_size_guess_ == 0);
  last_subsection_leb_size_guess_ = LEB_SECTION_SIZE_GUESS;
  last_subsection_offset_ =
      WriteU32Leb128Space(LEB_SECTION_SIZE_GUESS, "subsection size (guess)");
  last_subsection_payload_offset_ = stream_->offset();
}